

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O3

void cmCacheManager::OutputValueNoNewlines(ostream *fout,string *value)

{
  char cVar1;
  char *pcVar2;
  size_type sVar3;
  ostream *poVar4;
  char local_12;
  char local_11;
  
  pcVar2 = (value->_M_dataplus)._M_p;
  sVar3 = value->_M_string_length;
  if ((sVar3 != 0) && ((cVar1 = pcVar2[sVar3 - 1], cVar1 == ' ' || (cVar1 == '\t')))) {
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>(fout,&local_12,1);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,(value->_M_dataplus)._M_p,value->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_11,1);
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>(fout,pcVar2,sVar3);
  return;
}

Assistant:

void cmCacheManager::OutputValueNoNewlines(std::ostream& fout,
                                           std::string const& value)
{
  // if value has trailing space or tab, enclose it in single quotes
  if (!value.empty() && (value.back() == ' ' || value.back() == '\t')) {
    fout << '\'' << value << '\'';
  } else {
    fout << value;
  }
}